

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::ReadRawBlockFromDisk
          (BlockManager *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *block,
          FlatFilePos *pos)

{
  long lVar1;
  pointer puVar2;
  string_view source_file;
  string_view source_file_00;
  bool bVar3;
  Logger *pLVar4;
  size_t __nbytes;
  string *psVar5;
  long in_FS_OFFSET;
  string_view str;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view str_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  Level in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  char *in_stack_fffffffffffffe70;
  char (*in_stack_fffffffffffffe78) [21];
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  uint blk_size;
  AutoFile filein;
  FlatFilePos hpos;
  MessageStartChars blk_start;
  string local_130;
  string local_110;
  string local_f0 [4];
  string local_70;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hpos = *pos;
  if ((ulong)hpos >> 0x23 == 0) {
    FlatFilePos::ToString_abi_cxx11_(&log_msg,pos);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x5e;
    logging_function_01._M_str = "ReadRawBlockFromDisk";
    logging_function_01._M_len = 0x14;
    LogPrintf_<char[21],std::__cxx11::string>
              (logging_function_01,source_file_01,0x443,(LogFlags)&log_msg,in_stack_fffffffffffffe68
               ,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    std::__cxx11::string::~string((string *)&log_msg);
    bVar3 = false;
    goto LAB_007650e2;
  }
  hpos.nPos = hpos.nPos - 8;
  __nbytes = 1;
  OpenBlockFile(&filein,this,&hpos,true);
  if (filein.m_file == (FILE *)0x0) {
    FlatFilePos::ToString_abi_cxx11_(&log_msg,pos);
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_02._M_len = 0x5e;
    logging_function_02._M_str = "ReadRawBlockFromDisk";
    logging_function_02._M_len = 0x14;
    LogPrintf_<char[21],std::__cxx11::string>
              (logging_function_02,source_file_02,0x449,(LogFlags)&log_msg,in_stack_fffffffffffffe68
               ,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    psVar5 = &log_msg;
LAB_007650d1:
    std::__cxx11::string::~string((string *)psVar5);
    bVar3 = false;
  }
  else {
    Unserialize<AutoFile,_unsigned_char,_4UL>(&filein,&blk_start);
    blk_size = ser_readdata32<AutoFile>(&filein);
    bVar3 = std::operator==(&blk_start,&((this->m_opts).chainparams)->pchMessageStart);
    if (!bVar3) {
      FlatFilePos::ToString_abi_cxx11_(local_f0,pos);
      s.m_size = 4;
      s.m_data = blk_start._M_elems;
      HexStr_abi_cxx11_(&local_110,s);
      s_00.m_data = &((this->m_opts).chainparams)->pchMessageStart;
      s_00.m_size = 4;
      HexStr_abi_cxx11_(&local_130,s_00);
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar4);
      if (bVar3) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<char[21],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_70,
                   (tinyformat *)"%s: Block magic mismatch for %s: %s versus expected %s\n",
                   "ReadRawBlockFromDisk",(char (*) [21])local_f0,&local_110,&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pLVar4 = LogInstance();
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_00._M_len = 0x5e;
        str_00._M_str = log_msg._M_dataplus._M_p;
        str_00._M_len = log_msg._M_string_length;
        logging_function_00._M_str = "ReadRawBlockFromDisk";
        logging_function_00._M_len = 0x14;
        BCLog::Logger::LogPrintStr(pLVar4,str_00,logging_function_00,source_file_00,0x456,ALL,Error)
        ;
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)&local_130);
      psVar5 = &local_110;
LAB_007650c4:
      std::__cxx11::string::~string((string *)psVar5);
LAB_007650c9:
      psVar5 = local_f0;
      goto LAB_007650d1;
    }
    if (0x2000000 < (ulong)blk_size) {
      FlatFilePos::ToString_abi_cxx11_(local_f0,pos);
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar4);
      if (bVar3) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<char[21],std::__cxx11::string,unsigned_int,unsigned_long>
                  (&local_70,
                   (tinyformat *)
                   "%s: Block data is larger than maximum deserialization size for %s: %s versus %s\n"
                   ,"ReadRawBlockFromDisk",(char (*) [21])local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blk_size,
                   (uint *)&MAX_SIZE,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pLVar4 = LogInstance();
        local_110._M_dataplus._M_p = (pointer)0x5e;
        local_110._M_string_length = 0xcb2cf4;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "ReadRawBlockFromDisk";
        logging_function._M_len = 0x14;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x45c,ALL,Error);
        psVar5 = &log_msg;
        goto LAB_007650c4;
      }
      goto LAB_007650c9;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(block,(ulong)blk_size);
    puVar2 = (block->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = true;
    AutoFile::read(&filein,(int)puVar2,
                   (block->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish + -(long)puVar2,__nbytes);
  }
  AutoFile::~AutoFile(&filein);
LAB_007650e2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadRawBlockFromDisk(std::vector<uint8_t>& block, const FlatFilePos& pos) const
{
    FlatFilePos hpos = pos;
    // If nPos is less than 8 the pos is null and we don't have the block data
    // Return early to prevent undefined behavior of unsigned int underflow
    if (hpos.nPos < 8) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }
    hpos.nPos -= 8; // Seek back 8 bytes for meta header
    AutoFile filein{OpenBlockFile(hpos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    try {
        MessageStartChars blk_start;
        unsigned int blk_size;

        filein >> blk_start >> blk_size;

        if (blk_start != GetParams().MessageStart()) {
            LogError("%s: Block magic mismatch for %s: %s versus expected %s\n", __func__, pos.ToString(),
                         HexStr(blk_start),
                         HexStr(GetParams().MessageStart()));
            return false;
        }

        if (blk_size > MAX_SIZE) {
            LogError("%s: Block data is larger than maximum deserialization size for %s: %s versus %s\n", __func__, pos.ToString(),
                         blk_size, MAX_SIZE);
            return false;
        }

        block.resize(blk_size); // Zeroing of memory is intentional here
        filein.read(MakeWritableByteSpan(block));
    } catch (const std::exception& e) {
        LogError("%s: Read from block file failed: %s for %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    return true;
}